

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O0

void __thiscall enact::TupleTypename::~TupleTypename(TupleTypename *this)

{
  TupleTypename *this_local;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__TupleTypename_0016a990;
  std::__cxx11::string::~string((string *)&this->m_name);
  Token::~Token(&this->m_paren);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&this->m_elementTypenames);
  Typename::~Typename(&this->super_Typename);
  return;
}

Assistant:

~TupleTypename() override = default;